

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.h
# Opt level: O3

string * __thiscall
cmGlobalGenerator::FrameworkDescriptor::GetFullName_abi_cxx11_
          (string *__return_storage_ptr__,FrameworkDescriptor *this)

{
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_68;
  undefined8 local_50;
  char *local_48;
  undefined8 local_40;
  size_type local_38;
  pointer local_30;
  undefined8 local_28;
  size_type local_20;
  pointer local_18;
  undefined8 local_10;
  
  local_68.first._M_str = (this->Name)._M_dataplus._M_p;
  local_68.first._M_len = (this->Name)._M_string_length;
  local_68.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_50 = 0xb;
  local_48 = ".framework/";
  local_40 = 0;
  local_28 = 0;
  local_18 = (this->Suffix)._M_dataplus._M_p;
  local_20 = (this->Suffix)._M_string_length;
  local_10 = 0;
  views._M_len = 4;
  views._M_array = &local_68;
  local_38 = local_68.first._M_len;
  local_30 = local_68.first._M_str;
  cmCatViews(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

std::string GetFullName() const
    {
      return cmStrCat(this->Name, ".framework/"_s, this->Name, this->Suffix);
    }